

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

void __thiscall Shell::EqualityProxyMono::apply(EqualityProxyMono *this,Problem *prb)

{
  bool bVar1;
  Problem *in_RSI;
  Problem *in_RDI;
  UnitList **in_stack_00000008;
  EqualityProxyMono *in_stack_00000010;
  bool hadEquality;
  Problem *in_stack_ffffffffffffffd8;
  
  bVar1 = Kernel::Problem::hasEquality(in_stack_ffffffffffffffd8);
  Kernel::Problem::units(in_RSI);
  apply(in_stack_00000010,in_stack_00000008);
  Kernel::Problem::invalidateByRemoval(in_RDI);
  Kernel::Problem::reportEqualityEliminated(in_RDI);
  if ((bVar1) && (*(uint *)&in_RDI->_units < 3)) {
    Kernel::Problem::reportIncompleteTransformation(in_RSI);
  }
  return;
}

Assistant:

void EqualityProxyMono::apply(Problem& prb)
{
  bool hadEquality = prb.hasEquality();

  apply(prb.units());
  prb.invalidateByRemoval();
  prb.reportEqualityEliminated();

  if (hadEquality) {
    switch(_opt) {
      case Options::EqualityProxy::R:
      case Options::EqualityProxy::RS:
      case Options::EqualityProxy::RST:
	prb.reportIncompleteTransformation();
	break;
      default:
	break;
    }
  }
}